

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joynu.c
# Opt level: O1

_Bool al_reconfigure_joysticks(void)

{
  _Bool _Var1;
  
  if (new_joystick_driver == (ALLEGRO_JOYSTICK_DRIVER *)0x0) {
    return false;
  }
  if (new_joystick_driver->reconfigure_joysticks != (_func__Bool *)0x0) {
    _Var1 = (*new_joystick_driver->reconfigure_joysticks)();
    return _Var1;
  }
  (*new_joystick_driver->num_joysticks)();
  return true;
}

Assistant:

bool al_reconfigure_joysticks(void)
{
   if (!new_joystick_driver)
      return false;

   /* XXX only until Windows and Mac joystick drivers are updated */
   if (!new_joystick_driver->reconfigure_joysticks) {
      new_joystick_driver->num_joysticks();
      return true;
   }

   return new_joystick_driver->reconfigure_joysticks();
}